

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

SearchResult<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>,_false>
 __thiscall
absl::lts_20250127::container_internal::
btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
::internal_lower_bound<int>
          (btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
           *this,int *key)

{
  SearchResult<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>,_false>
  SVar1;
  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
  bVar2;
  int *key_local;
  btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
  *this_local;
  SearchResult<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>,_false>
  ret;
  
  SVar1 = internal_locate<int>(this,key);
  bVar2._8_8_ = SVar1.value._8_8_;
  bVar2.node_ = (btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                 *)(ulong)(uint)SVar1.value.position_;
  bVar2 = btree<absl::lts_20250127::container_internal::map_params<int,google::protobuf::internal::ExtensionSet::Extension,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,256,false>>
          ::
          internal_last<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,google::protobuf::internal::ExtensionSet::Extension,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,256,false>>,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>&,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>*>>
                    ((btree<absl::lts_20250127::container_internal::map_params<int,google::protobuf::internal::ExtensionSet::Extension,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,256,false>>
                      *)SVar1.value.node_,bVar2);
  SVar1.value._12_4_ = 0;
  SVar1.value.node_ =
       (btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
        *)SUB128(bVar2._0_12_,0);
  SVar1.value.position_ = SUB124(bVar2._0_12_,8);
  return (SearchResult<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>,_false>
          )SVar1.value;
}

Assistant:

auto btree<P>::internal_lower_bound(const K &key) const
    -> SearchResult<iterator, is_key_compare_to::value> {
  if (!params_type::template can_have_multiple_equivalent_keys<K>()) {
    SearchResult<iterator, is_key_compare_to::value> ret = internal_locate(key);
    ret.value = internal_last(ret.value);
    return ret;
  }
  iterator iter(const_cast<node_type *>(root()));
  SearchResult<size_type, is_key_compare_to::value> res;
  bool seen_eq = false;
  for (;;) {
    res = iter.node_->lower_bound(key, key_comp());
    iter.position_ = static_cast<int>(res.value);
    if (iter.node_->is_leaf()) {
      break;
    }
    seen_eq = seen_eq || res.IsEq();
    iter.node_ = iter.node_->child(static_cast<field_type>(iter.position_));
  }
  if (res.IsEq()) return {iter, MatchKind::kEq};
  return {internal_last(iter), seen_eq ? MatchKind::kEq : MatchKind::kNe};
}